

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scurve.c
# Opt level: O0

int SCurveSpdCtrl_Calc(SCurveSpdCtrl_t *pSCurveSpdCtrl)

{
  SCurveSpdCtrl_t *pSCurveSpdCtrl_local;
  
  if (pSCurveSpdCtrl->Flag == '\0') {
    return 0;
  }
  if (-0.01 <= pSCurveSpdCtrl->Spd - pSCurveSpdCtrl->TargetSpd) {
    if (pSCurveSpdCtrl->Spd - pSCurveSpdCtrl->TargetSpd <= 0.01) {
      return 1;
    }
    if (-pSCurveSpdCtrl->Dec * pSCurveSpdCtrl->TimeInc + pSCurveSpdCtrl->Spd <
        pSCurveSpdCtrl->TargetSpd) {
      return 1;
    }
    pSCurveSpdCtrl->Spd = -pSCurveSpdCtrl->Dec * pSCurveSpdCtrl->TimeInc + pSCurveSpdCtrl->Spd;
    pSCurveSpdCtrl->SpdOutput = pSCurveSpdCtrl->Spd;
  }
  else {
    if (pSCurveSpdCtrl->TargetSpd <
        pSCurveSpdCtrl->Acc * pSCurveSpdCtrl->TimeInc + pSCurveSpdCtrl->Spd) {
      return 1;
    }
    pSCurveSpdCtrl->Spd = pSCurveSpdCtrl->Acc * pSCurveSpdCtrl->TimeInc + pSCurveSpdCtrl->Spd;
    pSCurveSpdCtrl->SpdOutput = pSCurveSpdCtrl->Spd;
  }
  return 2;
}

Assistant:

int SCurveSpdCtrl_Calc(SCurveSpdCtrl_t *pSCurveSpdCtrl)
{
	if (pSCurveSpdCtrl->Flag == 0)
		return 0;

	if (pSCurveSpdCtrl->Spd - pSCurveSpdCtrl->TargetSpd < -0.01f)
	{
		if (pSCurveSpdCtrl->Spd + pSCurveSpdCtrl->Acc * pSCurveSpdCtrl->TimeInc <= pSCurveSpdCtrl->TargetSpd)
			pSCurveSpdCtrl->Spd += pSCurveSpdCtrl->Acc * pSCurveSpdCtrl->TimeInc;
		else
			return 1;
		pSCurveSpdCtrl->SpdOutput = pSCurveSpdCtrl->Spd;
	}
	else if (pSCurveSpdCtrl->Spd - pSCurveSpdCtrl->TargetSpd > 0.01f)
	{
		if (pSCurveSpdCtrl->Spd - pSCurveSpdCtrl->Dec * pSCurveSpdCtrl->TimeInc >= pSCurveSpdCtrl->TargetSpd)
			pSCurveSpdCtrl->Spd -= pSCurveSpdCtrl->Dec * pSCurveSpdCtrl->TimeInc;
		else
			return 1;
		pSCurveSpdCtrl->SpdOutput = pSCurveSpdCtrl->Spd;
	}
	else
	{
		return 1;
	}

	return 2;
}